

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O1

unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_> __thiscall
pegmatite::parse(pegmatite *this,Input *input,Rule *g,Rule *ws,ErrorReporter *err,ParserDelegate *d)

{
  char *pcVar1;
  pointer ppVar2;
  bool bVar3;
  pegmatite *ppVar4;
  ASTNode *pAVar5;
  ulong uVar6;
  pointer ppVar7;
  ASTStack st;
  vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = parse(input,g,ws,err,d,&local_48);
  ppVar2 = local_48.
           super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar3) {
    if (1 < (ulong)(((long)local_48.
                           super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_48.
                           super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) &&
        (long)local_48.
              super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_48.
              super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      uVar6 = 0;
      ppVar7 = local_48.
               super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pAVar5 = (ppVar7->second)._M_t.
                 super___uniq_ptr_impl<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pegmatite::ASTNode_*,_std::default_delete<pegmatite::ASTNode>_>
                 .super__Head_base<0UL,_pegmatite::ASTNode_*,_false>._M_head_impl;
        if (pAVar5 == (ASTNode *)0x0) {
          __cxa_bad_typeid();
          goto LAB_0012811f;
        }
        pcVar1 = *(char **)(pAVar5->_vptr_ASTNode[-1] + 8);
        fprintf(_stderr,"[%d] %s\n",uVar6,pcVar1 + (*pcVar1 == '*'));
        ppVar7 = ppVar7 + 1;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (ppVar7 != ppVar2);
    }
    if ((long)local_48.
              super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_48.
              super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x38) {
LAB_0012811f:
      __assert_fail("st.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/plietar[P]Pegmatite/ast.cc"
                    ,0xaa,
                    "std::unique_ptr<ASTNode> pegmatite::parse(Input &, const Rule &, const Rule &, ErrorReporter &, const ParserDelegate &)"
                   );
    }
    pAVar5 = ((local_48.
               super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second)._M_t.
             super___uniq_ptr_impl<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>.
             _M_t.
             super__Tuple_impl<0UL,_pegmatite::ASTNode_*,_std::default_delete<pegmatite::ASTNode>_>.
             super__Head_base<0UL,_pegmatite::ASTNode_*,_false>._M_head_impl;
    ppVar4 = (pegmatite *)
             &(local_48.
               super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second;
  }
  else {
    pAVar5 = (ASTNode *)0x0;
    ppVar4 = this;
  }
  *(ASTNode **)this = pAVar5;
  *(undefined8 *)ppVar4 = 0;
  std::
  vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
  ::~vector(&local_48);
  return (__uniq_ptr_data<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>,_true,_true>)
         (__uniq_ptr_data<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<ASTNode> parse(Input &input, const Rule &g, const Rule &ws,
                               ErrorReporter &err, const ParserDelegate &d)
{
	ASTStack st;
	if (!parse(input, g, ws, err, d, &st)) return nullptr;
	if (st.size() > 1)
	{
		int i = 0;
		for (auto &I : st)
		{
			auto *val = I.second.get();
			fprintf(stderr, "[%d] %s\n", i++, typeid(*val).name());
		}
	}
	assert(st.size() == 1);
	return std::move(st[0].second);
}